

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::printReconstructedExpression
          (ConsoleAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  Column *in_RDI;
  long in_FS_OFFSET;
  Colour colourGuard;
  Code in_stack_ffffffffffffff6c;
  Colour *in_stack_ffffffffffffff70;
  string *text;
  AssertionResult *in_stack_ffffffffffffff90;
  Column local_68;
  string local_28 [24];
  Column *in_stack_fffffffffffffff0;
  ostream *os;
  
  os = *(ostream **)(in_FS_OFFSET + 0x28);
  bVar1 = AssertionResult::hasExpandedExpression(in_stack_ffffffffffffff90);
  if (bVar1) {
    std::operator<<((ostream *)
                    (in_RDI->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,"with expansion:\n");
    Colour::Colour(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    text = (in_RDI->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_ffffffffffffff90);
    clara::TextFlow::Column::Column(in_RDI,text);
    clara::TextFlow::Column::indent(&local_68,2);
    poVar2 = clara::TextFlow::operator<<(os,in_stack_fffffffffffffff0);
    std::operator<<(poVar2,'\n');
    clara::TextFlow::Column::~Column((Column *)0x262d68);
    std::__cxx11::string::~string(local_28);
    Colour::~Colour((Colour *)0x262d7c);
  }
  if (*(ostream **)(in_FS_OFFSET + 0x28) != os) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            stream << "with expansion:\n";
            Colour colourGuard(Colour::ReconstructedExpression);
            stream << Column(result.getExpandedExpression()).indent(2) << '\n';
        }
    }